

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O2

void auxsort(lua_State *L,IdxT lo,IdxT up,uint rnd)

{
  int iVar1;
  clock_t cVar2;
  uint uVar3;
  uint uVar4;
  uint i;
  uint uVar5;
  long lVar6;
  uint local_6c;
  clock_t local_48;
  time_t local_40;
  
  local_6c = rnd;
  do {
    uVar4 = up - lo;
    if (up < lo || uVar4 == 0) {
      return;
    }
    lua_geti(L,1,(ulong)lo);
    lua_geti(L,1,(ulong)up);
    iVar1 = sort_comp(L,-1,-2);
    if (iVar1 == 0) {
      lua_settop(L,-3);
    }
    else {
      set2(L,lo,up);
    }
    if (uVar4 == 1) {
      return;
    }
    if ((uVar4 < 100) || (local_6c == 0)) {
      uVar3 = up + lo >> 1;
    }
    else {
      uVar3 = (uVar4 >> 2) + lo + local_6c % ((uVar4 >> 2) * 2);
    }
    lua_geti(L,1,(ulong)uVar3);
    lua_geti(L,1,(ulong)lo);
    iVar1 = sort_comp(L,-2,-1);
    uVar5 = lo;
    if (iVar1 == 0) {
      lua_settop(L,-2);
      lua_geti(L,1,(ulong)up);
      iVar1 = sort_comp(L,-1,-2);
      uVar5 = up;
      if (iVar1 != 0) goto LAB_0011c22c;
      lua_settop(L,-3);
    }
    else {
LAB_0011c22c:
      set2(L,uVar3,uVar5);
    }
    if (uVar4 == 2) {
      return;
    }
    lua_geti(L,1,(ulong)uVar3);
    lua_pushvalue(L,-1);
    uVar4 = up - 1;
    lua_geti(L,1,(ulong)uVar4);
    set2(L,uVar3,uVar4);
    uVar3 = lo;
    uVar5 = uVar4;
    while( true ) {
      while( true ) {
        lua_geti(L,1,(ulong)(uVar3 + 1));
        iVar1 = sort_comp(L,-1,-2);
        if (iVar1 == 0) break;
        if (up - 2 == uVar3) {
          luaL_error(L,"invalid order function for sorting");
        }
        lua_settop(L,-2);
        uVar3 = uVar3 + 1;
      }
      i = uVar3 + 1;
      while( true ) {
        uVar5 = uVar5 - 1;
        lua_geti(L,1,(ulong)uVar5);
        iVar1 = sort_comp(L,-3,-1);
        if (iVar1 == 0) break;
        if (uVar5 < i) {
          luaL_error(L,"invalid order function for sorting");
        }
        lua_settop(L,-2);
      }
      if (uVar5 < i) break;
      set2(L,i,uVar5);
      uVar3 = i;
    }
    lua_settop(L,-2);
    set2(L,uVar4,uVar3 + 1);
    uVar5 = (uVar3 - lo) + 1;
    uVar4 = uVar4 - uVar3;
    if (uVar5 < uVar4) {
      auxsort(L,lo,uVar3,local_6c);
      lo = uVar3 + 2;
      uVar4 = uVar5;
    }
    else {
      auxsort(L,uVar3 + 2,up,local_6c);
      up = uVar3;
    }
    if (uVar4 < up - lo >> 7) {
      cVar2 = clock();
      local_40 = time((time_t *)0x0);
      local_48 = cVar2;
      local_6c = 0;
      for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
        local_6c = local_6c + *(int *)((long)&local_48 + lVar6 * 4);
      }
    }
  } while( true );
}

Assistant:

static void auxsort (lua_State *L, IdxT lo, IdxT up,
                                   unsigned int rnd) {
  while (lo < up) {  /* loop for tail recursion */
    IdxT p;  /* Pivot index */
    IdxT n;  /* to be used later */
    /* sort elements 'lo', 'p', and 'up' */
    lua_geti(L, 1, lo);
    lua_geti(L, 1, up);
    if (sort_comp(L, -1, -2))  /* a[up] < a[lo]? */
      set2(L, lo, up);  /* swap a[lo] - a[up] */
    else
      lua_pop(L, 2);  /* remove both values */
    if (up - lo == 1)  /* only 2 elements? */
      return;  /* already sorted */
    if (up - lo < RANLIMIT || rnd == 0)  /* small interval or no randomize? */
      p = (lo + up)/2;  /* middle element is a good pivot */
    else  /* for larger intervals, it is worth a random pivot */
      p = choosePivot(lo, up, rnd);
    lua_geti(L, 1, p);
    lua_geti(L, 1, lo);
    if (sort_comp(L, -2, -1))  /* a[p] < a[lo]? */
      set2(L, p, lo);  /* swap a[p] - a[lo] */
    else {
      lua_pop(L, 1);  /* remove a[lo] */
      lua_geti(L, 1, up);
      if (sort_comp(L, -1, -2))  /* a[up] < a[p]? */
        set2(L, p, up);  /* swap a[up] - a[p] */
      else
        lua_pop(L, 2);
    }
    if (up - lo == 2)  /* only 3 elements? */
      return;  /* already sorted */
    lua_geti(L, 1, p);  /* get middle element (Pivot) */
    lua_pushvalue(L, -1);  /* push Pivot */
    lua_geti(L, 1, up - 1);  /* push a[up - 1] */
    set2(L, p, up - 1);  /* swap Pivot (a[p]) with a[up - 1] */
    p = partition(L, lo, up);
    /* a[lo .. p - 1] <= a[p] == P <= a[p + 1 .. up] */
    if (p - lo < up - p) {  /* lower interval is smaller? */
      auxsort(L, lo, p - 1, rnd);  /* call recursively for lower interval */
      n = p - lo;  /* size of smaller interval */
      lo = p + 1;  /* tail call for [p + 1 .. up] (upper interval) */
    }
    else {
      auxsort(L, p + 1, up, rnd);  /* call recursively for upper interval */
      n = up - p;  /* size of smaller interval */
      up = p - 1;  /* tail call for [lo .. p - 1]  (lower interval) */
    }
    if ((up - lo) / 128 > n) /* partition too imbalanced? */
      rnd = l_randomizePivot();  /* try a new randomization */
  }  /* tail call auxsort(L, lo, up, rnd) */
}